

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderRenderingPointsCase::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderRenderingPointsCase *this)

{
  int iVar1;
  TestError *this_00;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  GeometryShaderRenderingPointsCase *local_18;
  GeometryShaderRenderingPointsCase *this_local;
  string *result;
  
  local_18 = this;
  this_local = (GeometryShaderRenderingPointsCase *)__return_storage_ptr__;
  if ((getVertexShaderCode[abi:cxx11]()::lines_vs_code_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getVertexShaderCode[abi:cxx11]()::lines_vs_code_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&getVertexShaderCode[abi:cxx11]()::lines_vs_code_abi_cxx11_,
               "${VERSION}\n\nin      vec4  position;\nuniform ivec2 renderingTargetSize;\nout     vec4  vs_gs_color;\n\nvoid main()\n{\n    if (renderingTargetSize.y == 7)\n    {\n        gl_Position = position;    }\n    else\n    {\n        gl_Position = vec4(position.x, \n                           -1.0 + ((float(3 + gl_InstanceID * 7)) / float(renderingTargetSize.y - 1)) * 2.0,\n                           position.zw);\n    }\n\n    switch(gl_VertexID)\n    {\n        case 0: vs_gs_color = vec4(1, 0, 0, 0); break;\n        case 1: vs_gs_color = vec4(0, 1, 0, 0); break;\n        case 2: vs_gs_color = vec4(0, 0, 1, 0); break;\n        case 3: vs_gs_color = vec4(0, 0, 0, 1); break;\n        case 4: vs_gs_color = vec4(1, 1, 0, 0); break;\n        case 5: vs_gs_color = vec4(1, 0, 1, 0); break;\n        case 6: vs_gs_color = vec4(1, 0, 0, 1); break;\n        case 7: vs_gs_color = vec4(1, 1, 1, 0); break;\n        case 8: vs_gs_color = vec4(1, 1, 0, 1); break;\n    }\n}\n"
               ,&local_19);
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &getVertexShaderCode[abi:cxx11]()::lines_vs_code_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&getVertexShaderCode[abi:cxx11]()::lines_vs_code_abi_cxx11_);
  }
  if ((getVertexShaderCode[abi:cxx11]()::points_vs_code_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getVertexShaderCode[abi:cxx11]()::points_vs_code_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&getVertexShaderCode[abi:cxx11]()::points_vs_code_abi_cxx11_,
               "${VERSION}\n\nin      vec4  position;\nuniform ivec2 renderingTargetSize;\nout     vec4  vs_gs_color;\n\nvoid main()\n{\n    gl_PointSize = 1.0;\n\n    if (renderingTargetSize.y == 3)\n    {\n        gl_Position = position;\n    }\n    else\n    {\n        gl_Position = vec4(position.x,\n                           -1.0 + (1.5 + float(5 * gl_InstanceID)) / float(renderingTargetSize.y) * 2.0,\n                           position.zw);\n    }\n\n    switch(gl_VertexID)\n    {\n        case 0: vs_gs_color = vec4(1, 0, 0, 0); break;\n        case 1: vs_gs_color = vec4(0, 1, 0, 0); break;\n        case 2: vs_gs_color = vec4(0, 0, 1, 0); break;\n        case 3: vs_gs_color = vec4(0, 0, 0, 1); break;\n        case 4: vs_gs_color = vec4(1, 1, 0, 0); break;\n        case 5: vs_gs_color = vec4(1, 0, 1, 0); break;\n        case 6: vs_gs_color = vec4(1, 0, 0, 1); break;\n        case 7: vs_gs_color = vec4(1, 1, 1, 0); break;\n        case 8: vs_gs_color = vec4(1, 1, 0, 1); break;\n    }\n}\n"
               ,local_2d);
    std::allocator<char>::~allocator(local_2d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &getVertexShaderCode[abi:cxx11]()::points_vs_code_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&getVertexShaderCode[abi:cxx11]()::points_vs_code_abi_cxx11_);
  }
  if ((getVertexShaderCode[abi:cxx11]()::triangles_vs_code_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getVertexShaderCode[abi:cxx11]()::triangles_vs_code_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&getVertexShaderCode[abi:cxx11]()::triangles_vs_code_abi_cxx11_,
               "${VERSION}\n\nin      vec4  position;\nuniform ivec2 renderingTargetSize;\nout     vec4  vs_gs_color;\n\nvoid main()\n{\n    if (renderingTargetSize.y == 6)\n    {\n        gl_Position = position;\n    }\n    else\n    {\n        gl_Position = vec4(position.x,\n                           position.y + float(gl_InstanceID) * 6.0 / float(renderingTargetSize.y) * 2.0,\n                           position.zw);\n    }\n\n    switch(gl_VertexID)\n    {\n        case 0: vs_gs_color = vec4(0.1, 0.8, 0, 0); break;\n        case 1: vs_gs_color = vec4(0.2, 0.7, 0, 0); break;\n        case 2: vs_gs_color = vec4(0.3, 0.6, 1, 0); break;\n        case 3: vs_gs_color = vec4(0.4, 0.5, 0, 1); break;\n        case 4: vs_gs_color = vec4(0.5, 0.4, 0, 0); break;\n        case 5: vs_gs_color = vec4(0.6, 0.3, 1, 0); break;\n        case 6: vs_gs_color = vec4(0.7, 0.2, 0, 1); break;\n        case 7: vs_gs_color = vec4(0.8, 0.1, 1, 0); break;\n    }\n}\n"
               ,&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &getVertexShaderCode[abi:cxx11]()::triangles_vs_code_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&getVertexShaderCode[abi:cxx11]()::triangles_vs_code_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  iVar1 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (iVar1 == 0) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)&getVertexShaderCode[abi:cxx11]()::points_vs_code_abi_cxx11_);
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)&getVertexShaderCode[abi:cxx11]()::lines_vs_code_abi_cxx11_);
  }
  else {
    if (iVar1 != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported shader output type used",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x67c);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)&getVertexShaderCode[abi:cxx11]()::triangles_vs_code_abi_cxx11_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderRenderingPointsCase::getVertexShaderCode()
{
	static std::string lines_vs_code =
		"${VERSION}\n"
		"\n"
		"in      vec4  position;\n"
		"uniform ivec2 renderingTargetSize;\n"
		"out     vec4  vs_gs_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		/* non-instanced draw call cases */
		"    if (renderingTargetSize.y == 7)\n"
		"    {\n"
		"        gl_Position = position;"
		"    }\n"
		"    else\n"
		"    {\n"
		/* instanced draw call cases: */
		"        gl_Position = vec4(position.x, \n"
		"                           -1.0 + ((float(3 + gl_InstanceID * 7)) / float(renderingTargetSize.y - 1)) * 2.0,\n"
		"                           position.zw);\n"
		"    }\n"
		"\n"
		"    switch(gl_VertexID)\n"
		"    {\n"
		"        case 0: vs_gs_color = vec4(1, 0, 0, 0); break;\n"
		"        case 1: vs_gs_color = vec4(0, 1, 0, 0); break;\n"
		"        case 2: vs_gs_color = vec4(0, 0, 1, 0); break;\n"
		"        case 3: vs_gs_color = vec4(0, 0, 0, 1); break;\n"
		"        case 4: vs_gs_color = vec4(1, 1, 0, 0); break;\n"
		"        case 5: vs_gs_color = vec4(1, 0, 1, 0); break;\n"
		"        case 6: vs_gs_color = vec4(1, 0, 0, 1); break;\n"
		"        case 7: vs_gs_color = vec4(1, 1, 1, 0); break;\n"
		"        case 8: vs_gs_color = vec4(1, 1, 0, 1); break;\n"
		"    }\n"
		"}\n";

	static std::string points_vs_code =
		"${VERSION}\n"
		"\n"
		"in      vec4  position;\n"
		"uniform ivec2 renderingTargetSize;\n"
		"out     vec4  vs_gs_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gl_PointSize = 1.0;\n"
		"\n"
		/* non-instanced draw call cases */
		"    if (renderingTargetSize.y == 3)\n"
		"    {\n"
		"        gl_Position = position;\n"
		"    }\n"
		/* instanced draw call cases */
		"    else\n"
		"    {\n"
		"        gl_Position = vec4(position.x,\n"
		"                           -1.0 + (1.5 + float(5 * gl_InstanceID)) / float(renderingTargetSize.y) * 2.0,\n"
		"                           position.zw);\n"
		"    }\n"
		"\n"
		"    switch(gl_VertexID)\n"
		"    {\n"
		"        case 0: vs_gs_color = vec4(1, 0, 0, 0); break;\n"
		"        case 1: vs_gs_color = vec4(0, 1, 0, 0); break;\n"
		"        case 2: vs_gs_color = vec4(0, 0, 1, 0); break;\n"
		"        case 3: vs_gs_color = vec4(0, 0, 0, 1); break;\n"
		"        case 4: vs_gs_color = vec4(1, 1, 0, 0); break;\n"
		"        case 5: vs_gs_color = vec4(1, 0, 1, 0); break;\n"
		"        case 6: vs_gs_color = vec4(1, 0, 0, 1); break;\n"
		"        case 7: vs_gs_color = vec4(1, 1, 1, 0); break;\n"
		"        case 8: vs_gs_color = vec4(1, 1, 0, 1); break;\n"
		"    }\n"
		"}\n";

	static std::string triangles_vs_code =
		"${VERSION}\n"
		"\n"
		"in      vec4  position;\n"
		"uniform ivec2 renderingTargetSize;\n"
		"out     vec4  vs_gs_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    if (renderingTargetSize.y == 6)\n"
		"    {\n"
		"        gl_Position = position;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        gl_Position = vec4(position.x,\n"
		"                           position.y + float(gl_InstanceID) * 6.0 / float(renderingTargetSize.y) * 2.0,\n"
		"                           position.zw);\n"
		"    }\n"
		"\n"
		"    switch(gl_VertexID)\n"
		"    {\n"
		"        case 0: vs_gs_color = vec4(0.1, 0.8, 0, 0); break;\n"
		"        case 1: vs_gs_color = vec4(0.2, 0.7, 0, 0); break;\n"
		"        case 2: vs_gs_color = vec4(0.3, 0.6, 1, 0); break;\n"
		"        case 3: vs_gs_color = vec4(0.4, 0.5, 0, 1); break;\n"
		"        case 4: vs_gs_color = vec4(0.5, 0.4, 0, 0); break;\n"
		"        case 5: vs_gs_color = vec4(0.6, 0.3, 1, 0); break;\n"
		"        case 6: vs_gs_color = vec4(0.7, 0.2, 0, 1); break;\n"
		"        case 7: vs_gs_color = vec4(0.8, 0.1, 1, 0); break;\n"
		"    }\n"
		"}\n";
	std::string result;

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		result = lines_vs_code;

		break;
	}

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		result = points_vs_code;

		break;
	}

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		result = triangles_vs_code;

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported shader output type used");
	}
	} /* switch (m_output_type) */

	return result;
}